

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O0

Interval *
tcu::applyMonotone(Interval *__return_storage_ptr__,DoubleFunc2 *func,Interval *arg0,Interval *arg1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Interval *pIVar4;
  Interval **ppIVar5;
  double *pdVar6;
  undefined8 *puVar7;
  double *pdVar8;
  bool bVar9;
  deBool dVar10;
  float fVar11;
  Interval local_488;
  Interval local_470;
  Interval local_458;
  double local_440;
  double local_438;
  double local_430;
  Interval local_428;
  Interval *local_410;
  Interval *pIStack_408;
  Interval *local_400;
  Interval **local_3f8;
  Interval *point_7;
  double dStack_3e8;
  double local_3e0;
  double *local_3d8;
  Interval *point_6;
  Interval point_hi__3;
  Interval point_lo__3;
  Interval *point_dst__3;
  undefined8 *puStack_390;
  ScopedRoundingMode point_ctx__3;
  Interval *val_3;
  double y_3;
  double local_378;
  double local_370;
  Interval *local_368;
  Interval *pIStack_360;
  Interval *local_358;
  Interval **local_350;
  Interval *point_5;
  double dStack_340;
  double local_338;
  double *local_330;
  Interval *point_4;
  Interval point_hi__2;
  Interval point_lo__2;
  Interval *point_dst__2;
  double *pdStack_2e8;
  ScopedRoundingMode point_ctx__2;
  Interval *val_2;
  double y_2;
  double local_2d0;
  double local_2c8;
  undefined1 local_2c0 [8];
  Interval val_hi__1;
  Interval val_lo__1;
  Interval *val_dst__1;
  Interval *val_arg__1;
  Interval *tmp2__1;
  double x_1;
  double local_258 [3];
  Interval local_240;
  Interval *local_228;
  Interval *pIStack_220;
  Interval *local_218;
  Interval **local_210;
  Interval *point_3;
  double dStack_200;
  double local_1f8;
  double *local_1f0;
  Interval *point_2;
  Interval point_hi__1;
  Interval point_lo__1;
  Interval *point_dst__1;
  undefined8 *puStack_1a8;
  ScopedRoundingMode point_ctx__1;
  Interval *val_1;
  double y_1;
  double local_190;
  double local_188;
  Interval *local_180;
  Interval *pIStack_178;
  Interval *local_170;
  Interval **local_168;
  Interval *point_1;
  double dStack_158;
  double local_150;
  undefined8 *local_148;
  Interval *point;
  Interval point_hi_;
  undefined1 auStack_118 [8];
  Interval point_lo_;
  Interval *point_dst_;
  double *pdStack_f0;
  ScopedRoundingMode point_ctx_;
  Interval *val;
  double y;
  undefined1 local_c8 [8];
  Interval val_hi_;
  Interval val_lo_;
  Interval *val_dst_;
  Interval *val_arg_;
  Interval *tmp2_;
  double x;
  double local_70;
  double local_68;
  double local_60;
  Interval tmp2__hi_;
  Interval tmp2__lo_;
  Interval *tmp2__dst_;
  Interval *tmp2__arg_;
  Interval *arg1_local;
  Interval *arg0_local;
  DoubleFunc2 *func_local;
  
  Interval::Interval(__return_storage_ptr__);
  do {
    Interval::Interval((Interval *)&tmp2__hi_.m_hi);
    Interval::Interval((Interval *)&local_60);
    bVar9 = Interval::empty(arg0);
    if (bVar9) {
      Interval::Interval((Interval *)&x);
      *(double *)__return_storage_ptr__ = x;
      __return_storage_ptr__->m_lo = local_70;
      __return_storage_ptr__->m_hi = local_68;
    }
    else {
      dVar1 = Interval::lo(arg0);
      do {
        Interval::Interval((Interval *)&val_hi_.m_hi);
        Interval::Interval((Interval *)local_c8);
        bVar9 = Interval::empty(arg1);
        if (bVar9) {
          Interval::Interval((Interval *)&y);
          tmp2__hi_.m_hi = y;
        }
        else {
          dVar2 = Interval::lo(arg1);
          pdStack_f0 = &val_hi_.m_hi;
          do {
            ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst_ + 4));
            point_lo_.m_hi = (double)pdStack_f0;
            Interval::Interval((Interval *)auStack_118);
            Interval::Interval((Interval *)&point);
            local_148 = (undefined8 *)auStack_118;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            dVar3 = (*func)(dVar1,dVar2);
            Interval::Interval((Interval *)&point_1,dVar3);
            puVar7 = local_148;
            local_148[2] = local_150;
            dVar3 = dStack_158;
            *puVar7 = point_1;
            puVar7[1] = dVar3;
            local_168 = &point;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            dVar3 = (*func)(dVar1,dVar2);
            Interval::Interval((Interval *)&local_180,dVar3);
            ppIVar5 = local_168;
            local_168[2] = local_170;
            pIVar4 = pIStack_178;
            *ppIVar5 = local_180;
            ppIVar5[1] = pIVar4;
            Interval::operator|((Interval *)&y_1,(Interval *)auStack_118,(Interval *)&point);
            *(double *)point_lo_.m_hi = y_1;
            *(double *)((long)point_lo_.m_hi + 8) = local_190;
            *(double *)((long)point_lo_.m_hi + 0x10) = local_188;
            ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst_ + 4));
            dVar10 = ::deGetFalse();
          } while (dVar10 != 0);
          dVar2 = Interval::hi(arg1);
          puStack_1a8 = (undefined8 *)local_c8;
          do {
            ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst__1 + 4));
            puVar7 = puStack_1a8;
            Interval::Interval((Interval *)&point_hi__1.m_hi);
            Interval::Interval((Interval *)&point_2);
            local_1f0 = &point_hi__1.m_hi;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            dVar3 = (*func)(dVar1,dVar2);
            Interval::Interval((Interval *)&point_3,dVar3);
            pdVar6 = local_1f0;
            local_1f0[2] = local_1f8;
            dVar3 = dStack_200;
            *pdVar6 = (double)point_3;
            pdVar6[1] = dVar3;
            local_210 = &point_2;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            dVar3 = (*func)(dVar1,dVar2);
            Interval::Interval((Interval *)&local_228,dVar3);
            ppIVar5 = local_210;
            local_210[2] = local_218;
            pIVar4 = pIStack_220;
            *ppIVar5 = local_228;
            ppIVar5[1] = pIVar4;
            Interval::operator|(&local_240,(Interval *)&point_hi__1.m_hi,(Interval *)&point_2);
            *puVar7 = local_240._0_8_;
            puVar7[1] = local_240.m_lo;
            puVar7[2] = local_240.m_hi;
            ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst__1 + 4))
            ;
            dVar10 = ::deGetFalse();
          } while (dVar10 != 0);
          Interval::operator|((Interval *)local_258,(Interval *)&val_hi_.m_hi,(Interval *)local_c8);
          tmp2__hi_.m_hi = local_258[0];
        }
        bVar9 = Interval::hasNaN(arg1);
        if (bVar9) {
          fVar11 = std::numeric_limits<float>::quiet_NaN();
          Interval::Interval((Interval *)&x_1,(double)fVar11);
          Interval::operator|=((Interval *)&tmp2__hi_.m_hi,(Interval *)&x_1);
        }
        dVar10 = ::deGetFalse();
      } while (dVar10 != 0);
      dVar1 = Interval::hi(arg0);
      do {
        Interval::Interval((Interval *)&val_hi__1.m_hi);
        Interval::Interval((Interval *)local_2c0);
        bVar9 = Interval::empty(arg1);
        if (bVar9) {
          Interval::Interval((Interval *)&y_2);
          local_60 = y_2;
          tmp2__hi_._0_8_ = local_2d0;
          tmp2__hi_.m_lo = local_2c8;
        }
        else {
          dVar2 = Interval::lo(arg1);
          pdStack_2e8 = &val_hi__1.m_hi;
          do {
            ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst__2 + 4));
            pdVar8 = pdStack_2e8;
            Interval::Interval((Interval *)&point_hi__2.m_hi);
            Interval::Interval((Interval *)&point_4);
            local_330 = &point_hi__2.m_hi;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            dVar3 = (*func)(dVar1,dVar2);
            Interval::Interval((Interval *)&point_5,dVar3);
            pdVar6 = local_330;
            local_330[2] = local_338;
            dVar3 = dStack_340;
            *pdVar6 = (double)point_5;
            pdVar6[1] = dVar3;
            local_350 = &point_4;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            dVar3 = (*func)(dVar1,dVar2);
            Interval::Interval((Interval *)&local_368,dVar3);
            ppIVar5 = local_350;
            local_350[2] = local_358;
            pIVar4 = pIStack_360;
            *ppIVar5 = local_368;
            ppIVar5[1] = pIVar4;
            Interval::operator|((Interval *)&y_3,(Interval *)&point_hi__2.m_hi,(Interval *)&point_4)
            ;
            *pdVar8 = y_3;
            pdVar8[1] = local_378;
            pdVar8[2] = local_370;
            ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst__2 + 4))
            ;
            dVar10 = ::deGetFalse();
          } while (dVar10 != 0);
          dVar2 = Interval::hi(arg1);
          puStack_390 = (undefined8 *)local_2c0;
          do {
            ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst__3 + 4));
            puVar7 = puStack_390;
            Interval::Interval((Interval *)&point_hi__3.m_hi);
            Interval::Interval((Interval *)&point_6);
            local_3d8 = &point_hi__3.m_hi;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            dVar3 = (*func)(dVar1,dVar2);
            Interval::Interval((Interval *)&point_7,dVar3);
            pdVar6 = local_3d8;
            local_3d8[2] = local_3e0;
            dVar3 = dStack_3e8;
            *pdVar6 = (double)point_7;
            pdVar6[1] = dVar3;
            local_3f8 = &point_6;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            dVar3 = (*func)(dVar1,dVar2);
            Interval::Interval((Interval *)&local_410,dVar3);
            ppIVar5 = local_3f8;
            local_3f8[2] = local_400;
            pIVar4 = pIStack_408;
            *ppIVar5 = local_410;
            ppIVar5[1] = pIVar4;
            Interval::operator|(&local_428,(Interval *)&point_hi__3.m_hi,(Interval *)&point_6);
            *puVar7 = local_428._0_8_;
            puVar7[1] = local_428.m_lo;
            puVar7[2] = local_428.m_hi;
            ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst__3 + 4))
            ;
            dVar10 = ::deGetFalse();
          } while (dVar10 != 0);
          Interval::operator|((Interval *)&local_440,(Interval *)&val_hi__1.m_hi,
                              (Interval *)local_2c0);
          local_60 = local_440;
          tmp2__hi_._0_8_ = local_438;
          tmp2__hi_.m_lo = local_430;
        }
        bVar9 = Interval::hasNaN(arg1);
        if (bVar9) {
          fVar11 = std::numeric_limits<float>::quiet_NaN();
          Interval::Interval(&local_458,(double)fVar11);
          Interval::operator|=((Interval *)&local_60,&local_458);
        }
        dVar10 = ::deGetFalse();
      } while (dVar10 != 0);
      Interval::operator|(&local_470,(Interval *)&tmp2__hi_.m_hi,(Interval *)&local_60);
      __return_storage_ptr__->m_hasNaN = local_470.m_hasNaN;
      *(undefined7 *)&__return_storage_ptr__->field_0x1 = local_470._1_7_;
      __return_storage_ptr__->m_lo = local_470.m_lo;
      __return_storage_ptr__->m_hi = local_470.m_hi;
    }
    bVar9 = Interval::hasNaN(arg0);
    if (bVar9) {
      fVar11 = std::numeric_limits<float>::quiet_NaN();
      Interval::Interval(&local_488,(double)fVar11);
      Interval::operator|=(__return_storage_ptr__,&local_488);
    }
    dVar10 = ::deGetFalse();
  } while (dVar10 != 0);
  return __return_storage_ptr__;
}

Assistant:

Interval applyMonotone (DoubleFunc2& func, const Interval& arg0, const Interval& arg1)
{
	Interval ret;

	TCU_INTERVAL_APPLY_MONOTONE2(ret, x, arg0, y, arg1, val,
								 TCU_SET_INTERVAL(val, point, point = func(x, y)));

	return ret;
}